

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void modify_vps(Matrix<double> *mat,
               vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               *vps,uint beg_row)

{
  pointer ppVar1;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this;
  uint uVar2;
  Matrix<double> result;
  Matrix<double> local_90;
  
  Matrix<double>::Matrix(&local_90,mat);
  uVar2 = 0;
  while( true ) {
    ppVar1 = (vps->
             super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(vps->
                      super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
        (ulong)uVar2) break;
    __x = Matrix<double>::operator[](mat,ppVar1[uVar2].first);
    this = Matrix<double>::operator[](&local_90,beg_row + uVar2);
    std::vector<double,_std::allocator<double>_>::operator=(this,__x);
    uVar2 = uVar2 + 1;
  }
  Matrix<double>::operator=(mat,&local_90);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return;
}

Assistant:

void modify_vps(Matrix_d& mat, const std::vector<std::pair<unsigned, double>>& vps, unsigned beg_row){
    Matrix_d result=mat;
    for(unsigned i=0;i<vps.size();++i)
        result[beg_row+i]=mat[vps[i].first];
    mat=result;
}